

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O2

void ncnn::draw_rectangle_c2
               (uchar *pixels,int w,int h,int stride,int rx,int ry,int rw,int rh,uint color,
               int thickness)

{
  int x_1;
  int iVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uchar uVar7;
  uchar uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int x;
  int iVar12;
  long lVar13;
  int x_2;
  uint uVar14;
  long lVar15;
  uint uVar16;
  
  lVar15 = (long)h;
  lVar4 = (long)stride;
  uVar7 = (uchar)color;
  uVar8 = (uchar)(color >> 8);
  if (thickness == -1) {
    for (lVar9 = (long)ry; lVar9 < rh + ry; lVar9 = lVar9 + 1) {
      if (-1 < lVar9) {
        if (lVar15 <= lVar9) {
          return;
        }
        uVar16 = rx * 2;
        for (iVar12 = rx; iVar12 < rw + rx; iVar12 = iVar12 + 1) {
          if (-1 < iVar12) {
            if (w <= iVar12) break;
            pixels[(ulong)uVar16 + lVar9 * lVar4] = uVar7;
            pixels[(ulong)(uVar16 + 1) + lVar9 * lVar4] = uVar8;
          }
          uVar16 = uVar16 + 2;
        }
      }
    }
  }
  else {
    iVar1 = thickness / 2;
    iVar10 = thickness - iVar1;
    iVar5 = rx - iVar1;
    iVar6 = rw + rx + iVar10;
    lVar9 = (long)(iVar10 + ry);
    iVar12 = rx * 2;
    for (lVar13 = (long)(ry - iVar1); lVar13 < lVar9; lVar13 = lVar13 + 1) {
      if (-1 < lVar13) {
        if (lVar15 <= lVar13) break;
        uVar16 = iVar12 + iVar1 * -2;
        for (iVar2 = iVar5; iVar2 < iVar6; iVar2 = iVar2 + 1) {
          if (-1 < iVar2) {
            if (w <= iVar2) break;
            pixels[(ulong)uVar16 + lVar13 * lVar4] = uVar7;
            pixels[(ulong)(uVar16 + 1) + lVar13 * lVar4] = uVar8;
          }
          uVar16 = uVar16 + 2;
        }
      }
    }
    lVar11 = (long)((rh + ry) - iVar1);
    for (lVar13 = lVar11; lVar13 < iVar10 + rh + ry; lVar13 = lVar13 + 1) {
      if (-1 < lVar13) {
        if (lVar15 <= lVar13) break;
        uVar16 = iVar12 + iVar1 * -2;
        for (iVar2 = iVar5; iVar2 < iVar6; iVar2 = iVar2 + 1) {
          if (-1 < iVar2) {
            if (w <= iVar2) break;
            pixels[(ulong)uVar16 + lVar13 * lVar4] = uVar7;
            pixels[(ulong)(uVar16 + 1) + lVar13 * lVar4] = uVar8;
          }
          uVar16 = uVar16 + 2;
        }
      }
    }
    uVar14 = iVar12 + iVar1 * -2;
    uVar16 = uVar14 + 1;
    for (; iVar5 < iVar10 + rx; iVar5 = iVar5 + 1) {
      if (-1 < iVar5) {
        puVar3 = pixels + lVar4 * lVar9;
        lVar13 = lVar9;
        if (w <= iVar5) break;
        for (; lVar13 < lVar11; lVar13 = lVar13 + 1) {
          if (-1 < lVar13) {
            if (lVar15 <= lVar13) break;
            puVar3[uVar14] = uVar7;
            puVar3[uVar16] = uVar8;
          }
          puVar3 = puVar3 + lVar4;
        }
      }
      uVar14 = uVar14 + 2;
      uVar16 = uVar16 + 2;
    }
    iVar1 = (rw + rx) - iVar1;
    uVar14 = iVar1 * 2;
    uVar16 = iVar1 * 2 + 1;
    while( true ) {
      if (iVar6 <= iVar1) break;
      if (-1 < iVar1) {
        puVar3 = pixels + lVar4 * lVar9;
        lVar13 = lVar9;
        if (w <= iVar1) {
          return;
        }
        for (; lVar13 < lVar11; lVar13 = lVar13 + 1) {
          if (-1 < lVar13) {
            if (lVar15 <= lVar13) break;
            puVar3[uVar14] = uVar7;
            puVar3[uVar16] = uVar8;
          }
          puVar3 = puVar3 + lVar4;
        }
      }
      iVar1 = iVar1 + 1;
      uVar14 = uVar14 + 2;
      uVar16 = uVar16 + 2;
    }
  }
  return;
}

Assistant:

void draw_rectangle_c2(unsigned char* pixels, int w, int h, int stride, int rx, int ry, int rw, int rh, unsigned int color, int thickness)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    if (thickness == -1)
    {
        // filled
        for (int y = ry; y < ry + rh; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx; x < rx + rw; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }

        return;
    }

    const int t0 = thickness / 2;
    const int t1 = thickness - t0;

    // draw top
    {
        for (int y = ry - t0; y < ry + t1; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx - t0; x < rx + rw + t1; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }
    }

    // draw bottom
    {
        for (int y = ry + rh - t0; y < ry + rh + t1; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx - t0; x < rx + rw + t1; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }
    }

    // draw left
    for (int x = rx - t0; x < rx + t1; x++)
    {
        if (x < 0)
            continue;

        if (x >= w)
            break;

        for (int y = ry + t1; y < ry + rh - t0; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            p[x * 2 + 0] = pen_color[0];
            p[x * 2 + 1] = pen_color[1];
        }
    }

    // draw right
    for (int x = rx + rw - t0; x < rx + rw + t1; x++)
    {
        if (x < 0)
            continue;

        if (x >= w)
            break;

        for (int y = ry + t1; y < ry + rh - t0; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            p[x * 2 + 0] = pen_color[0];
            p[x * 2 + 1] = pen_color[1];
        }
    }
}